

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satelite.cpp
# Opt level: O2

void __thiscall Clasp::SatElite::attach(SatElite *this,uint32 clauseId,bool initialClause)

{
  uint32 *puVar1;
  undefined1 *puVar2;
  uint uVar3;
  Clause *pCVar4;
  uint32 i;
  uint uVar5;
  uint v;
  ulong k;
  
  pCVar4 = (this->super_SatPreprocessor).clauses_.ebo_.buf[clauseId];
  (pCVar4->data_).abstr = 0;
  for (uVar5 = 0; uVar5 != (*(uint *)&pCVar4->field_0x8 & 0x3fffffff); uVar5 = uVar5 + 1) {
    uVar3 = pCVar4->lits_[uVar5].rep_;
    v = uVar3 >> 2;
    k = (ulong)v;
    OccurList::add(this->occurs_ + k,clauseId,SUB41((uVar3 & 2) >> 1,0));
    puVar2 = &this->occurs_[k].field_0x18;
    *(ulong *)puVar2 = *(ulong *)puVar2 & 0x3fffffffffffffff;
    (pCVar4->data_).abstr =
         (pCVar4->data_).abstr | 1L << (((byte)pCVar4->lits_[uVar5].rep_ >> 2) - 1 & 0x3f);
    if ((v < (this->elimHeap_).indices_.ebo_.size) &&
       ((this->elimHeap_).indices_.ebo_.buf[k] != 0xffffffffffffffff)) {
      bk_lib::indexed_priority_queue<Clasp::SatElite::LessOccCost>::decrease(&this->elimHeap_,k);
    }
    else if (initialClause) {
      updateHeap(this,v);
    }
  }
  OccurList::addWatch(this->occurs_ + (pCVar4->lits_[0].rep_ >> 2),clauseId);
  addToSubQueue(this,clauseId);
  puVar1 = &(this->super_SatPreprocessor).stats.clAdded;
  *puVar1 = *puVar1 + (uint)!initialClause;
  return;
}

Assistant:

void SatElite::attach(uint32 clauseId, bool initialClause) {
	Clause& c = *clause(clauseId);
	c.abstraction() = 0;
	for (uint32 i = 0; i != c.size(); ++i) {
		Var v = c[i].var();
		occurs_[v].add(clauseId, c[i].sign());
		occurs_[v].unmark();
		c.abstraction() |= Clause::abstractLit(c[i]);
		if (elimHeap_.is_in_queue(v)) {
			elimHeap_.decrease(v);
		}
		else if (initialClause) {
			updateHeap(v);
		}
	}
	occurs_[c[0].var()].addWatch(clauseId);
	addToSubQueue(clauseId);
	stats.clAdded += !initialClause;
}